

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusItem(void)

{
  ImGuiScrollFlags scroll_flags;
  ImGuiNavMoveFlags move_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  
  window_00 = GImGui->CurrentWindow;
  pIVar1 = GImGui;
  if ((GImGui->DebugLogFlags & 2U) != 0) {
    DebugLog("FocusItem(0x%08x) in window \"%s\"\n",(ulong)(GImGui->LastItemData).ID,window_00->Name
            );
  }
  if (((pIVar1->DragDropActive & 1U) == 0) && (pIVar1->MovingWindow == (ImGuiWindow *)0x0)) {
    SetNavWindow(window_00);
    NavMoveRequestSubmit
              (move_flags,scroll_flags,(ImGuiNavMoveFlags)((ulong)pIVar1 >> 0x20),
               (ImGuiScrollFlags)pIVar1);
    NavMoveRequestResolveWithLastItem((ImGuiNavItemData *)window_00);
  }
  else if ((pIVar1->DebugLogFlags & 2U) != 0) {
    DebugLog("FocusItem() ignored while DragDropActive!\n");
  }
  return;
}

Assistant:

void ImGui::FocusItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IMGUI_DEBUG_LOG_FOCUS("FocusItem(0x%08x) in window \"%s\"\n", g.LastItemData.ID, window->Name);
    if (g.DragDropActive || g.MovingWindow != NULL) // FIXME: Opt-in flags for this?
    {
        IMGUI_DEBUG_LOG_FOCUS("FocusItem() ignored while DragDropActive!\n");
        return;
    }

    ImGuiNavMoveFlags move_flags = ImGuiNavMoveFlags_IsTabbing | ImGuiNavMoveFlags_FocusApi | ImGuiNavMoveFlags_NoSetNavHighlight | ImGuiNavMoveFlags_NoSelect;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    SetNavWindow(window);
    NavMoveRequestSubmit(ImGuiDir_None, ImGuiDir_Up, move_flags, scroll_flags);
    NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
}